

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O1

bool chaiscript::dispatch::detail::
     compare_types_cast<void,chaiscript::Type_Info_const&,chaiscript::Type_Info_const&,std::function<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>const&>
               (_func_void_Type_Info_ptr_Type_Info_ptr_function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>_ptr
                *param_1,Function_Params *params,Type_Conversions_State *t_conversions)

{
  Type_Conversions_State *in_RCX;
  _Any_data local_30;
  code *local_20;
  
  boxed_cast<chaiscript::Type_Info_const&>(params->m_begin,t_conversions);
  boxed_cast<chaiscript::Type_Info_const&>(params->m_begin + 1,t_conversions);
  boxed_cast<std::function<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>const&>
            ((function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *)&local_30,
             (chaiscript *)(params->m_begin + 2),(Boxed_Value *)t_conversions,in_RCX);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return true;
}

Assistant:

bool compare_types_cast(Ret (*)(Params...), const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) noexcept {
        try {
          std::vector<Boxed_Value>::size_type i = 0;
          (boxed_cast<Params>(params[i++], &t_conversions), ...);
          return true;
        } catch (const exception::bad_boxed_cast &) {
          return false;
        }
      }